

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O2

void * dlopen_wrapper(char *filename,int flags)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  void *pvVar5;
  
  pcVar4 = (code *)gotcha_get_wrappee(orig_dlopen_handle);
  pFVar1 = _stderr;
  if (0 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    fprintf(pFVar1,"[%d/%d][%s:%u] - User called dlopen(%s, 0x%x)\n",(ulong)uVar2,(ulong)uVar3,
            "gotcha_dl.c",0x28,filename);
  }
  pvVar5 = (void *)(*pcVar4)(filename);
  pFVar1 = _stderr;
  if (1 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    fprintf(pFVar1,
            "[%d/%d][%s:%u] - Searching new dlopened libraries for previously-not-found exports\n",
            (ulong)uVar2,(ulong)uVar3,"gotcha_dl.c",0x2b);
  }
  foreach_hash_entry(&notfound_binding_table,(void *)0x0,per_binding);
  pFVar1 = _stderr;
  if (1 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    fprintf(pFVar1,"[%d/%d][%s:%u] - Updating GOT entries for new dlopened libraries\n",(ulong)uVar2
            ,(ulong)uVar3,"gotcha_dl.c",0x2e);
  }
  update_all_library_gots(&function_hash_table);
  return pvVar5;
}

Assistant:

static void* dlopen_wrapper(const char* filename, int flags) {
   typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
   void *handle;
   debug_printf(1, "User called dlopen(%s, 0x%x)\n", filename, (unsigned int) flags);
   handle = orig_dlopen(filename,flags);

   debug_printf(2, "Searching new dlopened libraries for previously-not-found exports\n");
   foreach_hash_entry(&notfound_binding_table, NULL, per_binding);

   debug_printf(2, "Updating GOT entries for new dlopened libraries\n");
   update_all_library_gots(&function_hash_table);
  
   return handle;
}